

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbif.cpp
# Opt level: O3

void CVmBif::get_str_val_fname(char *buf,size_t buflen,char *str)

{
  size_t sVar1;
  
  sVar1 = CCharmapToLocal::map_utf8
                    (G_cmap_to_fname_X,buf,buflen - 1,str + 2,(ulong)*(ushort *)str,(size_t *)0x0);
  buf[sVar1] = '\0';
  return;
}

Assistant:

void CVmBif::get_str_val_fname(VMG_ char *buf, size_t buflen, const char *str)
{
    /* get the length */
    size_t copy_len = vmb_get_len(str);

    /* 
     *   map it into the local filename character set and store the result
     *   in the output buffer - reserve one byte for the null termination
     *   byte 
     */
    copy_len = G_cmap_to_fname->map_utf8(buf, buflen - 1,
                                         str + VMB_LEN, copy_len, 0);

    /* null-terminate the result */
    buf[copy_len] = '\0';
}